

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.h
# Opt level: O0

void __thiscall Minisat::SimpSolver::updateElimHeap(SimpSolver *this,Var v)

{
  bool bVar1;
  char *pcVar2;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff1;
  bool bVar3;
  lbool in_stack_fffffffffffffff2;
  lbool in_stack_fffffffffffffff3;
  
  bVar1 = Heap<Minisat::SimpSolver::ElimLt>::inHeap
                    ((Heap<Minisat::SimpSolver::ElimLt> *)
                     CONCAT44(in_ESI,CONCAT13(in_stack_fffffffffffffff3.value,
                                              CONCAT12(in_stack_fffffffffffffff2.value,
                                                       CONCAT11(in_stack_fffffffffffffff1,
                                                                in_stack_fffffffffffffff0)))),
                     (int)((ulong)in_RDI >> 0x20));
  bVar3 = true;
  if (!bVar1) {
    pcVar2 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x14e0),in_ESI);
    in_stack_ffffffffffffffe7 = false;
    bVar3 = (bool)in_stack_ffffffffffffffe7;
    if (*pcVar2 == '\0') {
      bVar1 = isEliminated((SimpSolver *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc)
      ;
      in_stack_ffffffffffffffe7 = false;
      bVar3 = (bool)in_stack_ffffffffffffffe7;
      if (!bVar1) {
        Solver::value((Solver *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
        lbool::lbool((lbool *)&stack0xfffffffffffffff2,'\x02');
        in_stack_ffffffffffffffe7 =
             lbool::operator==((lbool *)&stack0xfffffffffffffff3,in_stack_fffffffffffffff2);
        bVar3 = (bool)in_stack_ffffffffffffffe7;
      }
    }
  }
  if (bVar3 != false) {
    Heap<Minisat::SimpSolver::ElimLt>::update
              ((Heap<Minisat::SimpSolver::ElimLt> *)
               CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

inline void SimpSolver::updateElimHeap(Var v)
{
    assert(use_simplification);
    // if (!frozen[v] && !isEliminated(v) && value(v) == l_Undef)
    if (elim_heap.inHeap(v) || (!frozen[v] && !isEliminated(v) && value(v) == l_Undef)) elim_heap.update(v);
}